

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ComputeLinkPath
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *libPathFlag,string *libPathTerminator)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  ItemVector *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string *local_178;
  string *libDir;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ArtifactType local_94;
  cmGeneratorTarget *pcStack_90;
  ArtifactType type;
  cmGeneratorTarget *target;
  Item *item;
  const_iterator __end2;
  const_iterator __begin2;
  ItemVector *__range2;
  string local_58;
  undefined1 local_31;
  string *local_30;
  string *libPathTerminator_local;
  string *libPathFlag_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  string *linkPath;
  
  local_31 = 0;
  local_30 = libPathTerminator;
  libPathTerminator_local = libPathFlag;
  libPathFlag_local = (string *)cli;
  cli_local = (cmComputeLinkInformation *)this;
  this_local = (cmLinkLineComputer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            (&local_58,(cmComputeLinkInformation *)libPathFlag_local);
  bVar1 = std::operator==(&local_58,"Swift");
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    this_01 = cmComputeLinkInformation::GetItems((cmComputeLinkInformation *)libPathFlag_local);
    __end2 = std::
             vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             ::begin(this_01);
    item = (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                       *)&item), bVar1) {
      target = (cmGeneratorTarget *)
               __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end2);
      pcStack_90 = (cmGeneratorTarget *)(target->ObjectDirectory)._M_string_length;
      if ((pcStack_90 != (cmGeneratorTarget *)0x0) &&
         ((TVar2 = cmGeneratorTarget::GetType(pcStack_90), TVar2 == STATIC_LIBRARY ||
          (TVar2 = cmGeneratorTarget::GetType(pcStack_90), TVar2 == SHARED_LIBRARY)))) {
        local_94 = RuntimeBinaryArtifact;
        TVar2 = cmGeneratorTarget::GetType(pcStack_90);
        if ((TVar2 == SHARED_LIBRARY) &&
           (bVar1 = cmGeneratorTarget::IsDLLPlatform(pcStack_90), bVar1)) {
          local_94 = ImportLibraryArtifact;
        }
        std::operator+(&local_118," ",libPathTerminator_local);
        this_00 = (cmGeneratorTarget *)(target->ObjectDirectory)._M_string_length;
        cmComputeLinkInformation::GetConfig_abi_cxx11_
                  ((string *)&__range1,(cmComputeLinkInformation *)libPathFlag_local);
        cmGeneratorTarget::GetDirectory(&local_138,this_00,(string *)&__range1,local_94);
        std::operator+(&local_f8,&local_118,&local_138);
        std::operator+(&local_d8,&local_f8,local_30);
        std::operator+(&local_b8,&local_d8," ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&__range1);
        std::__cxx11::string::~string((string *)&local_118);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&__end2);
    }
  }
  this_02 = cmComputeLinkInformation::GetDirectories_abi_cxx11_
                      ((cmComputeLinkInformation *)libPathFlag_local);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_02);
  libDir = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&libDir), bVar1) {
    local_178 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    std::operator+(&local_1f8," ",libPathTerminator_local);
    ConvertToOutputForExisting(&local_218,this,local_178);
    std::operator+(&local_1d8,&local_1f8,&local_218);
    std::operator+(&local_1b8,&local_1d8,local_30);
    std::operator+(&local_198,&local_1b8," ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator)
{
  std::string linkPath;

  if (cli.GetLinkLanguage() == "Swift") {
    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->GetType() == cmStateEnums::SHARED_LIBRARY &&
            target->IsDLLPlatform()) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPath += " " + libPathFlag +
          item.Target->GetDirectory(cli.GetConfig(), type) +
          libPathTerminator + " ";
      }
    }
  }

  for (std::string const& libDir : cli.GetDirectories()) {
    linkPath += " " + libPathFlag + this->ConvertToOutputForExisting(libDir) +
      libPathTerminator + " ";
  }

  return linkPath;
}